

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_container_printf(bitset_container_t *v)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  int r;
  uint64_t t;
  uint64_t w;
  int i;
  _Bool iamfirst;
  uint32_t base;
  ulong local_20;
  int local_14;
  int local_c;
  
  printf("{");
  local_c = 0;
  bVar1 = true;
  for (local_14 = 0; local_14 < 0x400; local_14 = local_14 + 1) {
    for (local_20 = *(ulong *)(*(long *)(in_RDI + 8) + (long)local_14 * 8); local_20 != 0;
        local_20 = local_20 & (local_20 ^ 0xffffffffffffffff) + 1 ^ local_20) {
      iVar2 = roaring_trailing_zeroes(local_20);
      if (bVar1) {
        printf("%u",(ulong)(uint)(local_c + iVar2));
        bVar1 = false;
      }
      else {
        printf(",%u",(ulong)(uint)(local_c + iVar2));
      }
    }
    local_c = local_c + 0x40;
  }
  printf("}");
  return;
}

Assistant:

void bitset_container_printf(const bitset_container_t * v) {
	printf("{");
	uint32_t base = 0;
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = roaring_trailing_zeroes(w);
			if(iamfirst) {// predicted to be false
				printf("%u",base + r);
				iamfirst = false;
			} else {
				printf(",%u",base + r);
			}
			w ^= t;
		}
		base += 64;
	}
	printf("}");
}